

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_disk_read_complete
          (torrent *this,disk_buffer_holder *buffer,storage_error *se,peer_request *r,
          shared_ptr<libtorrent::aux::torrent::read_piece_struct> *rp)

{
  int *piVar1;
  element_type *peVar2;
  _func_int *p_Var3;
  error_category *peVar4;
  bool bVar5;
  undefined3 uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string_view job_name;
  int size;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_40;
  int local_34;
  
  peVar2 = (rp->
           super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar2->blocks_left = peVar2->blocks_left + -1;
  if ((se->ec).val_ == 0) {
    memcpy((peVar2->piece_data).px + r->start,buffer->m_buf,(long)r->length);
  }
  else {
    peVar2->fail = true;
    bVar5 = (se->ec).failed_;
    uVar6 = *(undefined3 *)&(se->ec).field_0x5;
    peVar4 = (se->ec).cat_;
    (peVar2->error).val_ = (se->ec).val_;
    (peVar2->error).failed_ = bVar5;
    *(undefined3 *)&(peVar2->error).field_0x5 = uVar6;
    (peVar2->error).cat_ = peVar4;
    job_name._M_str = "read";
    job_name._M_len = 4;
    handle_disk_error(this,job_name,se,(peer_connection *)0x0,none);
  }
  if (((rp->
       super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->blocks_left == 0) {
    local_34 = file_storage::piece_size
                         (&((this->super_torrent_hot_members).m_torrent_file.
                            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->m_files,(piece_index_t)(r->piece).m_val);
    p_Var3 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [5];
    if (((rp->
         super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr)->fail == true) {
      iVar7 = (*p_Var3)();
      get_handle((torrent *)&stack0xffffffffffffffb8);
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code&>
                ((alert_manager *)CONCAT44(extraout_var,iVar7),
                 (torrent_handle *)&stack0xffffffffffffffb8,&r->piece,
                 &((rp->
                   super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->error);
    }
    else {
      iVar7 = (*p_Var3)();
      get_handle((torrent *)&stack0xffffffffffffffb8);
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::shared_array<char>&,int&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar7),
                 (torrent_handle *)&stack0xffffffffffffffb8,&r->piece,
                 &((rp->
                   super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->piece_data,&stack0xffffffffffffffcc);
    }
    if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_40._M_head_impl !=
        (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&((local_40._M_head_impl)->m_piece_map).
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                .
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar7 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar7 = *(int *)((long)&((local_40._M_head_impl)->m_piece_map).
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                .
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&((local_40._M_head_impl)->m_piece_map).
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        .
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar7 + -1;
      }
      if (iVar7 == 1) {
        (*(code *)((local_40._M_head_impl)->m_piece_map).
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  .
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  return;
}

Assistant:

void torrent::on_disk_read_complete(disk_buffer_holder buffer
		, storage_error const& se
		, peer_request const&  r, std::shared_ptr<read_piece_struct> rp) try
	{
		// hold a reference until this function returns
		TORRENT_ASSERT(is_single_thread());

		--rp->blocks_left;
		if (se)
		{
			rp->fail = true;
			rp->error = se.ec;
			handle_disk_error("read", se);
		}
		else
		{
			std::memcpy(rp->piece_data.get() + r.start, buffer.data(), aux::numeric_cast<std::size_t>(r.length));
		}

		if (rp->blocks_left == 0)
		{
			int size = m_torrent_file->piece_size(r.piece);
			if (rp->fail)
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), r.piece, rp->error);
			}
			else
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), r.piece, rp->piece_data, size);
			}
		}
	}
	catch (...) { handle_exception(); }